

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  double **ppdVar19;
  int *piVar20;
  double **ppdVar21;
  double *pdVar22;
  double *pdVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  double *pdVar30;
  int k_1;
  long lVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double *local_a0;
  
  if (0 < partitionCount) {
    ppdVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials;
    iVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
    piVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
    ppdVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights;
    iVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    uVar16 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    uVar26 = 0;
    pdVar30 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
    local_a0 = pdVar30;
    do {
      iVar17 = piVar20[partitionIndices[uVar26]];
      iVar18 = piVar20[(long)partitionIndices[uVar26] + 1];
      pdVar22 = ppdVar19[bufferIndices[uVar26]];
      iVar1 = iVar17 * 4;
      pdVar23 = ppdVar21[categoryWeightsIndices[uVar26]];
      iVar27 = iVar1;
      if (iVar18 - iVar17 != 0 && iVar17 <= iVar18) {
        dVar2 = *pdVar23;
        iVar27 = iVar18 - iVar17;
        lVar29 = 0;
        do {
          pdVar30[iVar1 + lVar29] = dVar2 * pdVar22[iVar1 + lVar29];
          pdVar30[(long)iVar1 + lVar29 + 1] = dVar2 * pdVar22[(long)iVar1 + lVar29 + 1];
          pdVar30[(long)iVar1 + lVar29 + 2] = dVar2 * pdVar22[(long)iVar1 + lVar29 + 2];
          pdVar30[(long)iVar1 + lVar29 + 3] = dVar2 * pdVar22[(long)iVar1 + lVar29 + 3];
          lVar29 = lVar29 + 4;
          iVar27 = iVar27 + -1;
        } while (iVar27 != 0);
        iVar27 = iVar1 + (int)lVar29;
      }
      if (1 < (int)uVar16) {
        uVar25 = 1;
        local_a0 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
        do {
          iVar27 = iVar27 + ((iVar17 - iVar18) + iVar15) * 4;
          if (iVar17 < iVar18) {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = pdVar23[uVar25];
            lVar29 = 0;
            iVar24 = iVar18 - iVar17;
            do {
              auVar36._8_8_ = 0;
              auVar36._0_8_ = pdVar22[iVar27 + lVar29];
              auVar6._8_8_ = 0;
              auVar6._0_8_ = local_a0[iVar1 + lVar29];
              auVar6 = vfmadd213sd_fma(auVar36,auVar33,auVar6);
              local_a0[iVar1 + lVar29] = auVar6._0_8_;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = pdVar22[(long)iVar27 + lVar29 + 1];
              auVar7._8_8_ = 0;
              auVar7._0_8_ = local_a0[(long)iVar1 + lVar29 + 1];
              auVar6 = vfmadd213sd_fma(auVar37,auVar33,auVar7);
              local_a0[(long)iVar1 + lVar29 + 1] = auVar6._0_8_;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = pdVar22[(long)iVar27 + lVar29 + 2];
              auVar8._8_8_ = 0;
              auVar8._0_8_ = local_a0[(long)iVar1 + lVar29 + 2];
              auVar6 = vfmadd213sd_fma(auVar38,auVar33,auVar8);
              local_a0[(long)iVar1 + lVar29 + 2] = auVar6._0_8_;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = pdVar22[(long)iVar27 + lVar29 + 3];
              auVar9._8_8_ = 0;
              auVar9._0_8_ = local_a0[(long)iVar1 + lVar29 + 3];
              auVar6 = vfmadd213sd_fma(auVar39,auVar33,auVar9);
              local_a0[(long)iVar1 + lVar29 + 3] = auVar6._0_8_;
              lVar29 = lVar29 + 4;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
            iVar27 = iVar27 + (int)lVar29;
          }
          iVar27 = iVar27 + iVar14 * 4;
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar16);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uint)partitionCount);
    if (0 < partitionCount) {
      uVar26 = 0;
      do {
        piVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
        iVar14 = piVar20[partitionIndices[uVar26]];
        lVar29 = (long)iVar14;
        iVar15 = piVar20[(long)partitionIndices[uVar26] + 1];
        lVar31 = (long)iVar15;
        if (iVar14 < iVar15) {
          iVar15 = cumulativeScaleIndices[uVar26];
          pdVar30 = (this->super_BeagleCPUImpl<double,_1,_0>).gStateFrequencies
                    [stateFrequenciesIndices[uVar26]];
          dVar2 = pdVar30[1];
          dVar3 = *pdVar30;
          dVar4 = pdVar30[2];
          dVar5 = pdVar30[3];
          pdVar30 = local_a0 + (long)(iVar14 * 4) + 3;
          lVar28 = lVar29;
          do {
            auVar40._8_8_ = 0;
            auVar40._0_8_ = dVar3;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = pdVar30[-3];
            auVar34._8_8_ = 0;
            auVar34._0_8_ = dVar2 * pdVar30[-2];
            auVar33 = vfmadd231sd_fma(auVar34,auVar40,auVar10);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = dVar4;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = pdVar30[-1];
            auVar33 = vfmadd231sd_fma(auVar33,auVar41,auVar11);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = dVar5;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *pdVar30;
            auVar33 = vfmadd231sd_fma(auVar33,auVar42,auVar12);
            dVar32 = log(auVar33._0_8_);
            pdVar30 = pdVar30 + 4;
            pdVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
            pdVar22[lVar28] = dVar32;
            lVar28 = lVar28 + 1;
          } while (lVar31 != lVar28);
          if (iVar15 != -1) {
            pdVar30 = (this->super_BeagleCPUImpl<double,_1,_0>).gScaleBuffers[iVar15];
            lVar28 = lVar29;
            do {
              pdVar22[lVar28] = pdVar30[lVar28] + pdVar22[lVar28];
              lVar28 = lVar28 + 1;
            } while (lVar31 != lVar28);
          }
          auVar35 = ZEXT864(0) << 0x40;
          outSumLogLikelihoodByPartition[uVar26] = 0.0;
          pdVar30 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights;
          do {
            auVar43._8_8_ = 0;
            auVar43._0_8_ = pdVar22[lVar29];
            auVar13._8_8_ = 0;
            auVar13._0_8_ = pdVar30[lVar29];
            auVar33 = vfmadd231sd_fma(auVar35._0_16_,auVar43,auVar13);
            auVar35 = ZEXT1664(auVar33);
            lVar29 = lVar29 + 1;
            outSumLogLikelihoodByPartition[uVar26] = auVar33._0_8_;
          } while (lVar31 != lVar29);
        }
        else {
          outSumLogLikelihoodByPartition[uVar26] = 0.0;
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != (uint)partitionCount);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                                    const int* bufferIndices,
                                                                    const int* categoryWeightsIndices,
                                                                    const int* stateFrequenciesIndices,
                                                                    const int* cumulativeScaleIndices,
                                                                    const int* partitionIndices,
                                                                    int partitionCount,
                                                                    double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        assert(rootPartials);
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];

        int v = startPattern * 4;
        const REALTYPE wt0 = wt[0];
        for (int k = startPattern; k < endPattern; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            int u = startPattern * 4;
            v += ((kPatternCount - endPattern) + startPattern) * 4;
            const REALTYPE wtl = wt[l];
            for (int k = startPattern; k < endPattern; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
        v += 4 * kExtraPatterns;
        }
    }
    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}